

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void non_empty_opendir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  dir = opendir_req.ptr;
  if (req == &opendir_req) {
    eval_a = (int64_t)opendir_req.fs_type;
    eval_b = 0x1f;
    if (eval_a == 0x1f) {
      eval_a = opendir_req.result;
      eval_b = 0;
      if (opendir_req.result == 0) {
        if (opendir_req.ptr == (void *)0x0) {
          pcVar4 = "!=";
          eval_b = 0;
          pcVar6 = "!=";
          eval_a = 0;
          pcVar5 = "NULL";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          pcVar3 = "req->ptr";
          uVar2 = 0x149;
          goto LAB_001235d1;
        }
        *(uv_dirent_t **)opendir_req.ptr = dirents;
        *(undefined8 *)((long)dir + 8) = 1;
        loop = uv_default_loop();
        iVar1 = uv_fs_readdir(loop,&readdir_req,(uv_dir_t *)dir,non_empty_readdir_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uv_fs_req_cleanup(&opendir_req);
          non_empty_opendir_cb_count = non_empty_opendir_cb_count + 1;
          return;
        }
        pcVar5 = "0";
        pcVar3 = "r";
        uVar2 = 0x153;
      }
      else {
        pcVar5 = "0";
        pcVar3 = "req->result";
        uVar2 = 0x148;
      }
    }
    else {
      pcVar5 = "UV_FS_OPENDIR";
      pcVar3 = "req->fs_type";
      uVar2 = 0x147;
    }
    pcVar4 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar6 = "==";
  }
  else {
    pcVar4 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "req";
    uVar2 = 0x146;
    pcVar6 = "==";
    pcVar5 = "&opendir_req";
    eval_a = (int64_t)req;
    eval_b = (int64_t)&opendir_req;
  }
LAB_001235d1:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a,pcVar6,eval_b);
  abort();
}

Assistant:

static void non_empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);

  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);

  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    non_empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++non_empty_opendir_cb_count;
}